

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O3

void __thiscall
duckdb::Deserializer::ReadPropertyWithDefault<duckdb::vector<unsigned_long,true>>
          (Deserializer *this,field_id_t field_id,char *tag,vector<unsigned_long,_true> *ret)

{
  pointer puVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined6 in_register_00000032;
  long lVar3;
  pointer local_48;
  iterator iStack_40;
  pointer local_38;
  unsigned_long local_30;
  
  iVar2 = (*this->_vptr_Deserializer[4])(this,CONCAT62(in_register_00000032,field_id));
  if ((char)iVar2 != '\0') {
    local_48 = (pointer)0x0;
    iStack_40._M_current = (pointer)0x0;
    local_38 = (pointer)0x0;
    iVar2 = (*this->_vptr_Deserializer[8])(this);
    lVar3 = CONCAT44(extraout_var,iVar2);
    if (lVar3 != 0) {
      do {
        iVar2 = (*this->_vptr_Deserializer[0x15])(this);
        local_30 = CONCAT44(extraout_var_00,iVar2);
        if (iStack_40._M_current == local_38) {
          ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
          _M_realloc_insert<unsigned_long>
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_48,iStack_40,
                     &local_30);
        }
        else {
          *iStack_40._M_current = local_30;
          iStack_40._M_current = iStack_40._M_current + 1;
        }
        lVar3 = lVar3 + -1;
      } while (lVar3 != 0);
    }
    (*this->_vptr_Deserializer[9])(this);
    puVar1 = (ret->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    (ret->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = local_48;
    (ret->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = iStack_40._M_current;
    (ret->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = local_38;
    local_48 = (pointer)0x0;
    iStack_40._M_current = (unsigned_long *)0x0;
    local_38 = (pointer)0x0;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1);
      if (local_48 != (pointer)0x0) {
        operator_delete(local_48);
      }
    }
    (*this->_vptr_Deserializer[5])(this,1);
    return;
  }
  puVar1 = (ret->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  (ret->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (ret->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (ret->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  (*this->_vptr_Deserializer[5])(this,0);
  return;
}

Assistant:

inline void ReadPropertyWithDefault(const field_id_t field_id, const char *tag, T &ret) {
		if (!OnOptionalPropertyBegin(field_id, tag)) {
			ret = std::forward<T>(SerializationDefaultValue::GetDefault<T>());
			OnOptionalPropertyEnd(false);
			return;
		}
		ret = Read<T>();
		OnOptionalPropertyEnd(true);
	}